

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::IsFunctionCloneSuffix(char *str)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lStack_20;
  bool parsed;
  size_t i;
  char *str_local;
  
  lStack_20 = 0;
  do {
    if (str[lStack_20] == '\0') {
      return true;
    }
    bVar1 = false;
    if ((str[lStack_20] == '.') &&
       ((bVar2 = IsAlpha(str[lStack_20 + 1]), bVar2 || (str[lStack_20 + 1] == '_')))) {
      bVar1 = true;
      lStack_20 = lStack_20 + 2;
      while( true ) {
        bVar3 = IsAlpha(str[lStack_20]);
        bVar2 = true;
        if (!bVar3) {
          bVar2 = str[lStack_20] == '_';
        }
        if (!bVar2) break;
        lStack_20 = lStack_20 + 1;
      }
    }
    if ((str[lStack_20] == '.') && (bVar2 = IsDigit(str[lStack_20 + 1]), bVar2)) {
      bVar1 = true;
      lStack_20 = lStack_20 + 2;
      while (bVar2 = IsDigit(str[lStack_20]), bVar2) {
        lStack_20 = lStack_20 + 1;
      }
    }
  } while (bVar1);
  return false;
}

Assistant:

static bool IsFunctionCloneSuffix(const char *str) {
  size_t i = 0;
  while (str[i] != '\0') {
    bool parsed = false;
    // Consume a single [.<alpha> | _]*[.<digit>]* sequence.
    if (str[i] == '.' && (IsAlpha(str[i + 1]) || str[i + 1] == '_')) {
      parsed = true;
      i += 2;
      while (IsAlpha(str[i]) || str[i] == '_') {
        ++i;
      }
    }
    if (str[i] == '.' && IsDigit(str[i + 1])) {
      parsed = true;
      i += 2;
      while (IsDigit(str[i])) {
        ++i;
      }
    }
    if (!parsed)
      return false;
  }
  return true;  // Consumed everything in "str".
}